

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O1

void ImageDrawText(Image *dst,char *text,int posX,int posY,int fontSize,Color color)

{
  undefined1 auVar1 [16];
  Image src;
  Font font;
  Rectangle dstRec;
  Image local_a8;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  GlyphInfo *pGStack_68;
  int local_54;
  
  GetFontDefault();
  if (local_54 == 0) {
    LoadFontDefault();
  }
  GetFontDefault();
  font.glyphPadding = (undefined4)uStack_88;
  font.texture.id = uStack_88._4_4_;
  font.baseSize = (undefined4)local_90;
  font.glyphCount = local_90._4_4_;
  font.texture.width = (undefined4)local_80;
  font.texture.height = local_80._4_4_;
  font.texture.mipmaps = (undefined4)uStack_78;
  font.texture.format = uStack_78._4_4_;
  font.recs = (Rectangle *)local_70;
  font.glyphs = pGStack_68;
  ImageTextEx(&local_a8,font,text,(float)fontSize,1.0,color);
  src.height = local_a8.height;
  src.width = local_a8.width;
  dstRec.y = (float)posY;
  dstRec.x = (float)posX;
  src.data = local_a8.data;
  src.mipmaps = local_a8.mipmaps;
  src.format = local_a8.format;
  auVar1._4_4_ = (float)local_a8.height;
  auVar1._0_4_ = (float)local_a8.width;
  auVar1._8_8_ = 0;
  dstRec.height = (float)local_a8.height;
  dstRec.width = (float)local_a8.width;
  ImageDraw(dst,src,(Rectangle)(auVar1 << 0x40),dstRec,(Color)0xffffffff);
  free(local_a8.data);
  return;
}

Assistant:

void ImageDrawText(Image *dst, const char *text, int posX, int posY, int fontSize, Color color)
{
#if defined(SUPPORT_MODULE_RTEXT) && defined(SUPPORT_DEFAULT_FONT)
    // Make sure default font is loaded to be used on image text drawing
    if (GetFontDefault().texture.id == 0) LoadFontDefault();

    Vector2 position = { (float)posX, (float)posY };
    ImageDrawTextEx(dst, GetFontDefault(), text, position, (float)fontSize, 1.0f, color);   // WARNING: Module required: rtext
#else
    TRACELOG(LOG_WARNING, "IMAGE: ImageDrawText() requires module: rtext");
#endif
}